

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathMLASTVariableExpression.cpp
# Opt level: O2

void __thiscall
MathML::AST::VariableExpression::VariableExpression(VariableExpression *this,String *name)

{
  (this->super_INode)._vptr_INode = (_func_int **)&PTR__VariableExpression_00a05b50;
  std::__cxx11::string::string((string *)&this->mName,(string *)name);
  this->mValue = (ConstantExpression *)0x0;
  return;
}

Assistant:

VariableExpression::VariableExpression( const String& name )
                : mName( name )
                , mValue( 0 )
        {}